

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O3

int __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::AddItem(SDES *this,uint8_t *buf,size_t len)

{
  _List_node_base **pp_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  if ((this->sdessources).
      super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->sdessources) {
    p_Var2 = (this->sdesit)._M_node[1]._M_next;
    p_Var3 = p_Var2 + 3;
    p_Var3->_M_next = (_List_node_base *)((long)&p_Var3->_M_next->_M_next + len);
    p_Var3 = (_List_node_base *)operator_new(0x20);
    p_Var3[1]._M_next = (_List_node_base *)buf;
    p_Var3[1]._M_prev = (_List_node_base *)len;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    pp_Var1 = &p_Var2[2]._M_prev;
    *pp_Var1 = (_List_node_base *)((long)&(*pp_Var1)->_M_next + 1);
    return 0;
  }
  return -0x28;
}

Assistant:

int AddItem(uint8_t *buf,size_t len)
		{
			if (sdessources.empty())
				return ERR_RTP_RTCPCOMPPACKBUILDER_NOCURRENTSOURCE;
			(*sdesit)->AddItem(buf,len);
			return 0;
		}